

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplicationstatic.h
# Opt level: O0

void QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>::reset(void)

{
  long in_FS_OFFSET;
  QtSqlGlobals *unaff_retaddr;
  QMutexLocker<QBasicMutex> locker;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  QMutexLocker<QBasicMutex> *this;
  QMutexLocker<QBasicMutex> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_mutex = (QBasicMutex *)0xaaaaaaaaaaaaaaaa;
  local_18.m_isLocked = true;
  local_18._9_7_ = 0xaaaaaaaaaaaaaa;
  this = &local_18;
  QMutexLocker<QBasicMutex>::QMutexLocker
            (this,(QBasicMutex *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  realPointer();
  anon_unknown.dwarf_4455c::QtSqlGlobals::~QtSqlGlobals(unaff_retaddr);
  QBasicAtomicInteger<signed_char>::storeRelaxed
            ((QBasicAtomicInteger<signed_char> *)this,in_stack_ffffffffffffffdf);
  QMutexLocker<QBasicMutex>::~QMutexLocker(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void reset()
    {
        // we only synchronize using the mutex here, not the guard
        QMutexLocker locker(&mutex);
        realPointer()->~PlainType();
        guard.storeRelaxed(QtGlobalStatic::Uninitialized);
    }